

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

boolean is_racial_armor(obj *otmp,monst *mtmp)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  
  if (mtmp == &youmonst) {
    if (0xa9 < (ushort)urace.malenum) {
      if (urace.malenum == 0xaa) {
        return '\0';
      }
      if (urace.malenum == 0x111) {
        uVar1 = otmp->otyp;
        if ((uVar1 - 0x70 < 0x1a) && ((0x2002001U >> (uVar1 - 0x70 & 0x1f) & 1) != 0)) {
          return '\x01';
        }
        if (uVar1 == 0x48) {
          return '\x01';
        }
        return uVar1 == 0x99;
      }
      return '\0';
    }
    if (urace.malenum == 0x2d) {
      uVar3 = (ushort)otmp->otyp - 0x4a;
      if ((uVar3 < 0x36) && ((0x20002000000001U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        return '\x01';
      }
      return otmp->otyp == 0x8d;
    }
    if (urace.malenum != 0x4a) {
      return '\0';
    }
    uVar1 = otmp->otyp;
    if ((uVar1 - 0x72 < 0x19) && ((0x1001011U >> (uVar1 - 0x72 & 0x1f) & 1) != 0)) {
      return '\x01';
    }
    if (uVar1 == 0x49) {
      return '\x01';
    }
    return uVar1 == 0x8b;
  }
  if (mtmp == (monst *)0x0) {
    return '\0';
  }
  uVar3 = mtmp->data->mflags2;
  if ((uVar3 & 0x20) == 0) {
    if ((uVar3 & 0x10) == 0) {
      bVar4 = false;
      bVar2 = false;
      if ((uVar3 & 0x40) != 0) goto LAB_001b2d52;
      if (-1 < (char)uVar3) {
        bVar2 = true;
        goto LAB_001b2d52;
      }
      uVar1 = otmp->otyp;
      bVar4 = true;
      bVar2 = false;
      if (((uVar1 - 0x72 < 0x19) && ((0x1001011U >> (uVar1 - 0x72 & 0x1f) & 1) != 0)) ||
         (uVar1 == 0x49)) goto LAB_001b2d52;
      bVar4 = uVar1 == 0x8b;
    }
    else {
      uVar1 = otmp->otyp;
      bVar4 = true;
      bVar2 = false;
      if (((uVar1 - 0x70 < 0x1a) && ((0x2002001U >> (uVar1 - 0x70 & 0x1f) & 1) != 0)) ||
         (uVar1 == 0x48)) goto LAB_001b2d52;
      bVar4 = uVar1 == 0x99;
    }
  }
  else {
    uVar3 = (ushort)otmp->otyp - 0x4a;
    if ((uVar3 < 0x36) && ((0x20002000000001U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      bVar4 = true;
    }
    else {
      bVar4 = otmp->otyp == 0x8d;
    }
  }
  bVar2 = false;
LAB_001b2d52:
  if (!bVar2) {
    return bVar4;
  }
  return '\0';
}

Assistant:

boolean is_racial_armor(const struct obj *otmp, const struct monst *mtmp)
{
	if (mtmp == &youmonst) {
	    if (Race_if(PM_DWARF)) return is_dwarvish_armor(otmp);
	    else if (Race_if(PM_ELF)) return is_elven_armor(otmp);
	    else if (Race_if(PM_GNOME)) return is_gnomish_armor(otmp);
	    else if (Race_if(PM_ORC)) return is_orcish_armor(otmp);
	} else if (mtmp) {
	    const struct permonst *mdat = mtmp->data;
	    if (is_dwarf(mdat)) return is_dwarvish_armor(otmp);
	    else if (is_elf(mdat)) return is_elven_armor(otmp);
	    else if (is_gnome(mdat)) return is_gnomish_armor(otmp);
	    else if (is_orc(mdat)) return is_orcish_armor(otmp);
	}
	return FALSE;
}